

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddReorder.c
# Opt level: O2

DdNode * cuddDynamicAllocNode(DdManager *table)

{
  int *piVar1;
  int iVar2;
  DdNode **ppDVar3;
  DdNode *pDVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  _func_void_long *p_Var8;
  
  p_Var8 = Extra_UtilMMoutOfMemory;
  pDVar4 = table->nextFree;
  if (pDVar4 == (DdNode *)0x0) {
    ppDVar3 = (DdNode **)malloc(0xa000);
    if (ppDVar3 == (DdNode **)0x0) {
      if (table->stash == (char *)0x0) {
LAB_00669c3a:
        (*p_Var8)(0x9fd8);
        table->errorCode = CUDD_MEMORY_OUT;
        return (DdNode *)0x0;
      }
      free(table->stash);
      table->stash = (char *)0x0;
      table->maxCacheHard = table->cacheSlots - 1;
      table->cacheSlack = ~table->cacheSlots;
      iVar2 = table->size;
      lVar5 = 0x14;
      for (lVar7 = 0; lVar7 < iVar2; lVar7 = lVar7 + 1) {
        piVar1 = (int *)((long)&table->subtables->nodelist + lVar5);
        *piVar1 = *piVar1 << 2;
        lVar5 = lVar5 + 0x38;
      }
      ppDVar3 = (DdNode **)malloc(0xa000);
      p_Var8 = Extra_UtilMMoutOfMemory;
      if (ppDVar3 == (DdNode **)0x0) goto LAB_00669c3a;
    }
    table->memused = table->memused + 0x9fd8;
    *ppDVar3 = (DdNode *)table->memoryList;
    table->memoryList = ppDVar3;
    uVar6 = (ulong)(0x20 - ((uint)ppDVar3 & 0x1f) & 0xfffffff8);
    pDVar4 = (DdNode *)(uVar6 + (long)ppDVar3);
    lVar7 = 0x3fd;
    lVar5 = (long)ppDVar3 + uVar6;
    do {
      *(undefined4 *)(lVar5 + 4) = 0;
      *(long *)(lVar5 + 8) = lVar5 + 0x28;
      lVar7 = lVar7 + -1;
      lVar5 = lVar5 + 0x28;
    } while (lVar7 != 0);
    pDVar4[0x3fd].ref = 0;
    pDVar4[0x3fd].next = (DdNode *)0x0;
  }
  table->nextFree = pDVar4->next;
  return pDVar4;
}

Assistant:

DdNode *
cuddDynamicAllocNode(
  DdManager * table)
{
    int     i;
    DdNodePtr *mem;
    DdNode *list, *node;
    extern DD_OOMFP MMoutOfMemory;
    DD_OOMFP saveHandler;

    if (table->nextFree == NULL) {        /* free list is empty */
        /* Try to allocate a new block. */
        saveHandler = MMoutOfMemory;
        MMoutOfMemory = Cudd_OutOfMem;
//        mem = (DdNodePtr *) ABC_ALLOC(DdNode, DD_MEM_CHUNK + 1);
        mem = (DdNodePtr *) ABC_ALLOC(DdNode, DD_MEM_CHUNK + 2);
        MMoutOfMemory = saveHandler;
        if (mem == NULL && table->stash != NULL) {
            ABC_FREE(table->stash);
            table->stash = NULL;
            /* Inhibit resizing of tables. */
            table->maxCacheHard = table->cacheSlots - 1;
            table->cacheSlack = - (int) (table->cacheSlots + 1);
            for (i = 0; i < table->size; i++) {
                table->subtables[i].maxKeys <<= 2;
            }
//            mem = (DdNodePtr *) ABC_ALLOC(DdNode,DD_MEM_CHUNK + 1);
            mem = (DdNodePtr *) ABC_ALLOC(DdNode,DD_MEM_CHUNK + 2);
        }
        if (mem == NULL) {
            /* Out of luck. Call the default handler to do
            ** whatever it specifies for a failed malloc.  If this
            ** handler returns, then set error code, print
            ** warning, and return. */
            (*MMoutOfMemory)(sizeof(DdNode)*(DD_MEM_CHUNK + 1));
            table->errorCode = CUDD_MEMORY_OUT;
#ifdef DD_VERBOSE
            (void) fprintf(table->err,
                           "cuddDynamicAllocNode: out of memory");
            (void) fprintf(table->err,"Memory in use = %lu\n",
                           table->memused);
#endif
            return(NULL);
        } else {        /* successful allocation; slice memory */
            unsigned long offset;
            table->memused += (DD_MEM_CHUNK + 1) * sizeof(DdNode);
            mem[0] = (DdNode *) table->memoryList;
            table->memoryList = mem;

            /* Here we rely on the fact that the size of a DdNode is a
            ** power of 2 and a multiple of the size of a pointer.
            ** If we align one node, all the others will be aligned
            ** as well. */
//            offset = (unsigned long) mem & (sizeof(DdNode) - 1);
//            mem += (sizeof(DdNode) - offset) / sizeof(DdNodePtr);
            offset = (unsigned long) mem & (32 - 1);
            mem += (32 - offset) / sizeof(DdNodePtr);
#ifdef DD_DEBUG
//            assert(((unsigned long) mem & (sizeof(DdNode) - 1)) == 0);
            assert(((unsigned long) mem & (32 - 1)) == 0);
#endif
            list = (DdNode *) mem;

            i = 1;
            do {
                list[i - 1].ref = 0;
                list[i - 1].next = &list[i];
            } while (++i < DD_MEM_CHUNK);

            list[DD_MEM_CHUNK-1].ref = 0;
            list[DD_MEM_CHUNK - 1].next = NULL;

            table->nextFree = &list[0];
        }
    } /* if free list empty */

    node = table->nextFree;
    table->nextFree = node->next;
    //node->Id = 0;
    return (node);

}